

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# recovery_test.cc
# Opt level: O3

void __thiscall
leveldb::RecoveryTest_MultipleMemTables_Test::~RecoveryTest_MultipleMemTables_Test
          (RecoveryTest_MultipleMemTables_Test *this)

{
  RecoveryTest::~RecoveryTest(&this->super_RecoveryTest);
  operator_delete(this);
  return;
}

Assistant:

TEST_F(RecoveryTest, MultipleMemTables) {
  // Make a large log.
  const int kNum = 1000;
  for (int i = 0; i < kNum; i++) {
    char buf[100];
    std::snprintf(buf, sizeof(buf), "%050d", i);
    ASSERT_LEVELDB_OK(Put(buf, buf));
  }
  ASSERT_EQ(0, NumTables());
  Close();
  ASSERT_EQ(0, NumTables());
  ASSERT_EQ(1, NumLogs());
  uint64_t old_log_file = FirstLogFile();

  // Force creation of multiple memtables by reducing the write buffer size.
  Options opt;
  opt.reuse_logs = true;
  opt.write_buffer_size = (kNum * 100) / 2;
  Open(&opt);
  ASSERT_LE(2, NumTables());
  ASSERT_EQ(1, NumLogs());
  ASSERT_NE(old_log_file, FirstLogFile()) << "must not reuse log";
  for (int i = 0; i < kNum; i++) {
    char buf[100];
    std::snprintf(buf, sizeof(buf), "%050d", i);
    ASSERT_EQ(buf, Get(buf));
  }
}